

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O0

char * vrna_read_line(FILE *fp)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int l2;
  int l;
  int size;
  int len;
  char *cp;
  char *line;
  char s [512];
  FILE *fp_local;
  
  l = 0;
  l2 = 0;
  cp = (char *)0x0;
  do {
    pcVar2 = fgets((char *)&line,0x200,(FILE *)fp);
    if (pcVar2 == (char *)0x0) {
      return cp;
    }
    pcVar2 = strchr((char *)&line,10);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
    }
    sVar3 = strlen((char *)&line);
    iVar1 = l + (int)sVar3;
    if (l2 < iVar1 + 1) {
      l2 = (int)((double)(iVar1 + 1) * 1.2);
      cp = (char *)vrna_realloc(cp,l2);
    }
    memcpy(cp + l,&line,(long)(int)sVar3);
    cp[iVar1] = '\0';
    l = iVar1;
  } while (pcVar2 == (char *)0x0);
  return cp;
}

Assistant:

PUBLIC char *
vrna_read_line(FILE *fp)
{
  /* reads lines of arbitrary length from fp */

  char  s[512], *line, *cp;
  int   len = 0, size = 0, l, l2;

  line = NULL;
  do {
    if (fgets(s, 512, fp) == NULL)
      break;

    cp = strchr(s, '\n');
    if (cp != NULL)
      *cp = '\0';

    l2  = (int)strlen(s);
    l   = len + l2;
    if (l + 1 > size) {
      size  = (int)((l + 1) * 1.2);
      line  = (char *)vrna_realloc(line, size * sizeof(char));
    }
    memcpy(line + len,
           s,
           sizeof(char) * l2);

    line[l] = '\0';
    len = l;
  } while (cp == NULL);

  return line;
}